

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# socks_connecter.cpp
# Opt level: O2

void __thiscall zmq::socks_connecter_t::set_auth_method_none(socks_connecter_t *this)

{
  this->_auth_method = 0;
  (this->_auth_username)._M_string_length = 0;
  *(this->_auth_username)._M_dataplus._M_p = '\0';
  (this->_auth_password)._M_string_length = 0;
  *(this->_auth_password)._M_dataplus._M_p = '\0';
  return;
}

Assistant:

void zmq::socks_connecter_t::set_auth_method_none ()
{
    _auth_method = socks_no_auth_required;
    _auth_username.clear ();
    _auth_password.clear ();
}